

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  RunContext *this_00;
  TestGroupStats *in_RDX;
  GroupInfo *in_RDI;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  GroupInfo *in_stack_ffffffffffffff30;
  undefined1 local_88 [112];
  TestGroupStats *local_18;
  
  local_18 = in_RDX;
  this_00 = (RunContext *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 6));
  GroupInfo::GroupInfo
            (in_stack_ffffffffffffff30,&in_RDI->name,(size_t)this_00,
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  aborting(this_00);
  TestGroupStats::TestGroupStats(local_18,in_RDI,(Totals *)this_00,(bool)in_stack_ffffffffffffff1f);
  (*(this_00->super_IResultCapture)._vptr_IResultCapture[0xe])(this_00,local_88);
  TestGroupStats::~TestGroupStats((TestGroupStats *)0x1c9dcb);
  GroupInfo::~GroupInfo((GroupInfo *)0x1c9dd5);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }